

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::NewFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,bool isGenerator,
          RegSlot homeObjLocation)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value;
  RegSlot instance;
  undefined4 *puVar3;
  undefined7 in_register_00000009;
  OpCode opcode;
  uint lineNumber;
  
  CheckOpen(this);
  value = ConsumeReg(this,destinationRegister);
  if ((int)CONCAT71(in_register_00000009,isGenerator) == 0) {
    if (((this->m_functionWrite->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) ==
        Flags_None) {
      opcode = (ushort)(homeObjLocation != 0xffffffff) * 3 + NewScFunc;
    }
    else {
      opcode = NewStackScFunc;
      if (homeObjLocation != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x911,"(!hasHomeObj)","!hasHomeObj");
        if (!bVar2) goto LAB_007cffa5;
        *puVar3 = 0;
      }
    }
  }
  else {
    opcode = NewScGenFuncHomeObj;
    if (homeObjLocation == 0xffffffff) {
      opcode = NewScGenFunc;
    }
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x918,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                "OpCodeAttr::HasMultiSizeLayout(opcode)");
    if (!bVar2) goto LAB_007cffa5;
    *puVar3 = 0;
  }
  if (homeObjLocation == 0xffffffff) {
    bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,opcode,value,index);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,opcode,value,index);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,opcode,value,index);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    lineNumber = 0x921;
  }
  else {
    instance = ConsumeReg(this,homeObjLocation);
    bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,opcode,value,instance,index);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,opcode,value,instance,index);
    if (bVar2) {
      return;
    }
    bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                      (this,opcode,value,instance,index);
    if (bVar2) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    lineNumber = 0x91d;
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,lineNumber,"(success)","success");
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
LAB_007cffa5:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::NewFunction(RegSlot destinationRegister, uint index, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;
        destinationRegister = ConsumeReg(destinationRegister);
        OpCode opcode = OpCode::NewScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewScGenFuncHomeObj : OpCode::NewScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, homeObjLocation, index);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlotI1, opcode, destinationRegister, index);
        }
    }